

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

int __thiscall
vkt::pipeline::TestTexture3D::copy(TestTexture3D *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TestTexture3D *this_00;
  TextureFormat format_local;
  
  format_local = (TextureFormat)src;
  this_00 = (TestTexture3D *)operator_new(0x78);
  TestTexture3D(this_00,&format_local,*(int *)(dst + 0x58),*(int *)(dst + 0x5c),*(int *)(dst + 0x60)
               );
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)this_00;
  TestTexture::copyToTexture((TestTexture *)dst,(TestTexture *)this_00);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTexture3D::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTexture3D(format, m_texture.getWidth(), m_texture.getHeight(), m_texture.getDepth()));

	copyToTexture(*texture);

	return texture;
}